

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Point2f __thiscall pbrt::detail::Hammersley2DIter::operator*(Hammersley2DIter *this)

{
  Point2<float> *in_RDI;
  float x;
  uint64_t in_stack_00000018;
  int in_stack_00000024;
  float in_stack_ffffffffffffffe8;
  Tuple2<pbrt::Point2,_float> local_8;
  
  x = (float)(int)(in_RDI->super_Tuple2<pbrt::Point2,_float>).x /
      (float)(int)(in_RDI->super_Tuple2<pbrt::Point2,_float>).y;
  RadicalInverse(in_stack_00000024,in_stack_00000018);
  Point2<float>::Point2(in_RDI,x,in_stack_ffffffffffffffe8);
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f operator*() { return {Float(i) / Float(n), RadicalInverse(0, i)}; }